

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

uint __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,int id,int depth,QStringList *propertyNames,
          QDBusPlatformMenu *topLevelMenu)

{
  bool bVar1;
  QDebug *o;
  QDBusPlatformMenuItem *this_00;
  QDBusPlatformMenu *menu_00;
  int in_EDX;
  int in_ESI;
  QMessageLogger *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QDBusPlatformMenu *menu;
  QDBusPlatformMenuItem *item;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QStringList *in_stack_ffffffffffffff08;
  char **propertyNames_00;
  int iVar3;
  QDBusPlatformMenu *in_stack_ffffffffffffff18;
  QDBusMenuLayoutItem *in_stack_ffffffffffffff20;
  QLatin1StringView in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff40 [16];
  uint local_8c;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  undefined1 *local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xaa;
  uStack_2f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1ecc27e::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
    anon_unknown.dwarf_1ecc27e::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xaf5ba3);
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (char *)0xaf5bbc);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff40._8_8_);
    o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffefc);
    QDebug::QDebug(&local_48,o);
    ::operator<<((QDebug *)in_stack_ffffffffffffff18,(QList<QString> *)in_RDI);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    local_30 = 0;
  }
  (in_RDI->context).version = in_ESI;
  if (in_ESI == 0) {
    propertyNames_00 = &(in_RDI->context).file;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)propertyNames_00,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffff30);
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)propertyNames_00,
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    ::QVariant::QVariant(&local_28,(QLatin1String *)QVar2.m_size);
    QMap<QString,_QVariant>::insert
              ((QMap<QString,_QVariant> *)in_RDI,(QString *)propertyNames_00,
               (QVariant *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    iVar3 = (int)((ulong)in_RDI >> 0x20);
    ::QVariant::~QVariant(&local_28);
    QString::~QString((QString *)0xaf5d1c);
    if (in_R8 != 0) {
      populate(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,iVar3,
               (QStringList *)propertyNames_00);
    }
    local_8c = 1;
  }
  else {
    this_00 = QDBusPlatformMenuItem::byId((int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    iVar3 = (int)((ulong)in_RDI >> 0x20);
    if ((this_00 == (QDBusPlatformMenuItem *)0x0) ||
       (menu_00 = (QDBusPlatformMenu *)QDBusPlatformMenuItem::menu((QDBusPlatformMenuItem *)this_00)
       , menu_00 == (QDBusPlatformMenu *)0x0)) {
      local_8c = 1;
    }
    else {
      if (in_EDX != 0) {
        populate((QDBusMenuLayoutItem *)this_00,menu_00,iVar3,in_stack_ffffffffffffff08);
      }
      local_8c = QDBusPlatformMenu::revision((QDBusPlatformMenu *)menu_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_8c;
}

Assistant:

uint QDBusMenuLayoutItem::populate(int id, int depth, const QStringList &propertyNames, const QDBusPlatformMenu *topLevelMenu)
{
    qCDebug(qLcMenu) << id << "depth" << depth << propertyNames;
    m_id = id;
    if (id == 0) {
        m_properties.insert("children-display"_L1, "submenu"_L1);
        if (topLevelMenu)
            populate(topLevelMenu, depth, propertyNames);
        return 1; // revision
    }

    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    if (item) {
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());

        if (menu) {
            if (depth != 0)
                populate(menu, depth, propertyNames);
            return menu->revision();
        }
    }

    return 1; // revision
}